

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O0

cl_program xmrig::createFromSource(IOclRunner *runner)

{
  cl_int cVar1;
  uint uVar2;
  cl_device_id *device_list;
  char *pcVar3;
  long lVar4;
  uint64_t uVar5;
  char *pcVar6;
  uint64_t uVar7;
  char *in_RSI;
  long *in_RDI;
  undefined1 auVar8 [12];
  cl_program program;
  uint64_t ts;
  char *source;
  cl_device_id device;
  cl_int ret;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  String *this;
  _func_void_cl_program_void_ptr *in_stack_ffffffffffffff90;
  cl_int *in_stack_ffffffffffffff98;
  cl_program options;
  undefined4 in_stack_ffffffffffffffa8;
  cl_uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  cl_uint in_stack_ffffffffffffffb4;
  cl_program in_stack_ffffffffffffffb8;
  int local_14;
  cl_program local_8;
  
  device_list = (cl_device_id *)ocl_tag();
  auVar8 = (**(code **)(*in_RDI + 0x30))();
  pcVar3 = OclDevice::index((OclDevice *)(auVar8._0_8_ + 0x20),in_RSI,auVar8._8_4_);
  Log::print(INFO,"%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;33mcompiling...\x1b[0m",device_list,
             (ulong)pcVar3 & 0xffffffff);
  lVar4 = (**(code **)(*in_RDI + 0x30))();
  OclDevice::id((OclDevice *)(lVar4 + 0x20));
  (**(code **)(*in_RDI + 0x28))();
  uVar5 = Chrono::steadyMSecs();
  (**(code **)(*in_RDI + 0x10))();
  local_8 = OclLib::createProgramWithSource
                      ((cl_context)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                       (char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (size_t *)device_list,in_stack_ffffffffffffff98);
  if (local_14 == 0) {
    options = local_8;
    (**(code **)(*in_RDI + 0x18))();
    pcVar3 = (char *)0x1;
    cVar1 = OclLib::buildProgram
                      ((cl_program)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,device_list,(char *)options,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (cVar1 == 0) {
      pcVar6 = ocl_tag();
      auVar8 = (**(code **)(*in_RDI + 0x30))();
      pcVar3 = OclDevice::index((OclDevice *)(auVar8._0_8_ + 0x20),pcVar3,auVar8._8_4_);
      uVar2 = (uint)pcVar3;
      uVar7 = Chrono::steadyMSecs();
      Log::print(INFO,
                 "%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;32mcompilation completed\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m"
                 ,pcVar6,(ulong)uVar2,uVar7 - uVar5);
    }
    else {
      this = (String *)&stack0xffffffffffffffb8;
      OclLib::getProgramBuildLog
                (in_stack_ffffffffffffffb8,
                 (cl_device_id)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      pcVar3 = String::data(this);
      printf("BUILD LOG:\n%s\n",pcVar3);
      String::~String((String *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      OclLib::release((cl_program)this);
      local_8 = (cl_program)0x0;
    }
  }
  else {
    local_8 = (cl_program)0x0;
  }
  return local_8;
}

Assistant:

static cl_program createFromSource(const IOclRunner *runner)
{
    LOG_INFO("%s GPU " WHITE_BOLD("#%zu") " " YELLOW_BOLD("compiling..."), ocl_tag(), runner->data().device.index());

    cl_int ret;
    cl_device_id device = runner->data().device.id();
    const char *source  = runner->source();
    const uint64_t ts   = Chrono::steadyMSecs();

    cl_program program = OclLib::createProgramWithSource(runner->ctx(), 1, &source, nullptr, &ret);
    if (ret != CL_SUCCESS) {
        return nullptr;
    }

    if (OclLib::buildProgram(program, 1, &device, runner->buildOptions()) != CL_SUCCESS) {
        printf("BUILD LOG:\n%s\n", OclLib::getProgramBuildLog(program, device).data());

        OclLib::release(program);
        return nullptr;
    }

    LOG_INFO("%s GPU " WHITE_BOLD("#%zu") " " GREEN_BOLD("compilation completed") BLACK_BOLD(" (%" PRIu64 " ms)"),
             ocl_tag(), runner->data().device.index(), Chrono::steadyMSecs() - ts);

    return program;
}